

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepScanLineInputFile::initialize(DeepScanLineInputFile *this,Header *header)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  uint *puVar4;
  bool *pbVar5;
  char *pcVar6;
  int iVar7;
  Format FVar8;
  string *psVar9;
  int *piVar10;
  LineOrder *pLVar11;
  Box2i *pBVar12;
  ulong uVar13;
  uint *puVar14;
  Compression *pCVar15;
  Compressor *pCVar16;
  LineBuffer *pLVar17;
  bool *pbVar18;
  char *pcVar19;
  ChannelList *this_00;
  const_iterator cVar20;
  ConstIterator CVar21;
  ostream *poVar22;
  ArgExc *pAVar23;
  Data *pDVar24;
  Data *pDVar25;
  ConstIterator tmp;
  long lVar26;
  long lVar27;
  stringstream _iex_throw_s;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  psVar9 = Header::type_abi_cxx11_(header);
  __n = psVar9->_M_string_length;
  if (__n == _DAT_004a5628) {
    if (__n != 0) {
      iVar7 = bcmp((psVar9->_M_dataplus)._M_p,Imf_2_5::DEEPSCANLINE_abi_cxx11_,__n);
      if (iVar7 != 0) goto LAB_001f6dca;
    }
    piVar10 = Header::version(header);
    if (*piVar10 != 1) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Version ",8);
      piVar10 = Header::version(header);
      poVar22 = (ostream *)std::ostream::operator<<(local_1a8,*piVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar22," not supported for deepscanline images in this version of the library",
                 0x45);
      pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar23,(stringstream *)local_1b8);
      __cxa_throw(pAVar23,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    Header::operator=(&this->_data->header,header);
    pLVar11 = Header::lineOrder(&this->_data->header);
    pDVar25 = this->_data;
    pDVar25->lineOrder = *pLVar11;
    pBVar12 = Header::dataWindow(&pDVar25->header);
    iVar7 = (pBVar12->min).x;
    pDVar25 = this->_data;
    pDVar25->minX = iVar7;
    iVar1 = (pBVar12->max).x;
    pDVar25->maxX = iVar1;
    iVar2 = (pBVar12->min).y;
    pDVar25->minY = iVar2;
    iVar3 = (pBVar12->max).y;
    pDVar25->maxY = iVar3;
    lVar26 = (long)((iVar3 - iVar2) + 1);
    lVar27 = (long)((iVar1 - iVar7) + 1);
    uVar13 = lVar26 * lVar27;
    puVar14 = (uint *)operator_new__(-(ulong)(uVar13 >> 0x3e != 0) | uVar13 * 4);
    puVar4 = (pDVar25->sampleCount)._data;
    pDVar24 = pDVar25;
    if (puVar4 != (uint *)0x0) {
      operator_delete__(puVar4);
      pDVar24 = this->_data;
    }
    (pDVar25->sampleCount)._sizeX = lVar26;
    (pDVar25->sampleCount)._sizeY = lVar27;
    (pDVar25->sampleCount)._data = puVar14;
    lVar26 = (long)pDVar24->maxY - (long)pDVar24->minY;
    uVar13 = 0xffffffffffffffff;
    if (-2 < (int)lVar26) {
      uVar13 = lVar26 * 4 + 4;
    }
    puVar14 = (uint *)operator_new__(uVar13);
    puVar4 = (pDVar24->lineSampleCount)._data;
    pDVar25 = pDVar24;
    if (puVar4 != (uint *)0x0) {
      operator_delete__(puVar4);
      pDVar25 = this->_data;
    }
    (pDVar24->lineSampleCount)._size = lVar26 + 1;
    (pDVar24->lineSampleCount)._data = puVar14;
    pCVar15 = Header::compression(&pDVar25->header);
    pCVar16 = newCompressor(*pCVar15,0,&this->_data->header);
    iVar7 = numLinesInBuffer(pCVar16);
    pDVar25 = this->_data;
    pDVar25->linesInBuffer = iVar7;
    if (pCVar16 != (Compressor *)0x0) {
      (*pCVar16->_vptr_Compressor[1])(pCVar16);
      pDVar25 = this->_data;
      iVar7 = pDVar25->linesInBuffer;
    }
    pDVar25->nextLineBufferMinY = pDVar25->minY + -1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&pDVar25->lineOffsets,(long)((((pBVar12->max).y - (pBVar12->min).y) + iVar7) / iVar7)
              );
    pDVar25 = this->_data;
    if ((pDVar25->lineBuffers).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pDVar25->lineBuffers).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 0;
      do {
        pLVar17 = (LineBuffer *)operator_new(0x88);
        pLVar17->minY = 0;
        pLVar17->maxY = 0;
        (pLVar17->buffer)._size = 0;
        (pLVar17->buffer)._data = (char *)0x0;
        pLVar17->dataPtr = (char *)0x0;
        FVar8 = defaultFormat((Compressor *)0x0);
        pLVar17->scanLineMin = FVar8;
        pLVar17->scanLineMax = -1;
        *(undefined1 *)&pLVar17->compressor = 0;
        *(size_type **)&pLVar17->partiallyFull = &(pLVar17->exception)._M_string_length;
        (pLVar17->exception)._M_dataplus._M_p = (pointer)0x0;
        *(undefined1 *)&(pLVar17->exception)._M_string_length = 0;
        IlmThread_2_5::Semaphore::Semaphore
                  ((Semaphore *)((long)&(pLVar17->exception).field_2 + 8),1);
        (this->_data->lineBuffers).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar13] = pLVar17;
        uVar13 = uVar13 + 1;
        pDVar25 = this->_data;
      } while (uVar13 < (ulong)((long)(pDVar25->lineBuffers).
                                      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pDVar25->lineBuffers).
                                      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    uVar13 = (ulong)((pDVar25->maxY - pDVar25->minY) + 1);
    pbVar18 = (bool *)operator_new__(uVar13);
    pbVar5 = (pDVar25->gotSampleCount)._data;
    pDVar24 = pDVar25;
    if (pbVar5 != (bool *)0x0) {
      operator_delete__(pbVar5);
      pDVar24 = this->_data;
    }
    (pDVar25->gotSampleCount)._size = uVar13;
    (pDVar25->gotSampleCount)._data = pbVar18;
    iVar7 = pDVar24->maxY - pDVar24->minY;
    if (-1 < iVar7) {
      memset((pDVar24->gotSampleCount)._data,0,(ulong)(iVar7 + 1));
    }
    iVar1 = iVar7 + 1;
    if (pDVar24->linesInBuffer <= iVar7 + 1) {
      iVar1 = pDVar24->linesInBuffer;
    }
    iVar7 = ((pDVar24->maxX - pDVar24->minX) + 1) * iVar1 * 4;
    pDVar24->maxSampleCountTableSize = iVar7;
    pcVar19 = (char *)operator_new__((long)iVar7);
    pcVar6 = (pDVar24->sampleCountTableBuffer)._data;
    pDVar25 = pDVar24;
    if (pcVar6 != (char *)0x0) {
      operator_delete__(pcVar6);
      pDVar25 = this->_data;
    }
    (pDVar24->sampleCountTableBuffer)._size = (long)iVar7;
    (pDVar24->sampleCountTableBuffer)._data = pcVar19;
    pCVar15 = Header::compression(&pDVar25->header);
    pCVar16 = newCompressor(*pCVar15,(long)this->_data->maxSampleCountTableSize,&this->_data->header
                           );
    pDVar25 = this->_data;
    pDVar25->sampleCountTableComp = pCVar16;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&pDVar25->bytesPerLine,(long)((pDVar25->maxY - pDVar25->minY) + 1));
    this_00 = Header::channels(header);
    this->_data->combinedSampleSize = 0;
    cVar20._M_node = (_Base_ptr)ChannelList::begin(this_00);
    while( true ) {
      CVar21 = ChannelList::end(this_00);
      if ((const_iterator)cVar20._M_node == CVar21._i._M_node) {
        return;
      }
      if (2 < (ulong)cVar20._M_node[9]._M_color) break;
      piVar10 = &this->_data->combinedSampleSize;
      *piVar10 = *piVar10 + *(int *)(&DAT_0040dc68 + (ulong)cVar20._M_node[9]._M_color * 4);
      cVar20._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar20._M_node);
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Bad type for channel ",0x15);
    poVar22 = std::operator<<(local_1a8,(char *)(cVar20._M_node + 1));
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar22," initializing deepscanline reader",0x21);
    pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar23,(stringstream *)local_1b8);
    __cxa_throw(pAVar23,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
LAB_001f6dca:
  pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc
            (pAVar23,"Can\'t build a DeepScanLineInputFile from a type-mismatched part.");
  __cxa_throw(pAVar23,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void DeepScanLineInputFile::initialize(const Header& header)
{
    try
    {
        if (header.type() != DEEPSCANLINE)
            throw IEX_NAMESPACE::ArgExc("Can't build a DeepScanLineInputFile from "
            "a type-mismatched part.");
        
        if(header.version()!=1)
        {
            THROW(IEX_NAMESPACE::ArgExc, "Version " << header.version() << " not supported for deepscanline images in this version of the library");
        }
        
        _data->header = header;

        _data->lineOrder = _data->header.lineOrder();

        const Box2i &dataWindow = _data->header.dataWindow();

        _data->minX = dataWindow.min.x;
        _data->maxX = dataWindow.max.x;
        _data->minY = dataWindow.min.y;
        _data->maxY = dataWindow.max.y;

        _data->sampleCount.resizeErase(_data->maxY - _data->minY + 1,
                                       _data->maxX - _data->minX + 1);
        _data->lineSampleCount.resizeErase(_data->maxY - _data->minY + 1);

        Compressor* compressor = newCompressor(_data->header.compression(),
                                               0,
                                               _data->header);

        _data->linesInBuffer = numLinesInBuffer (compressor);

        delete compressor;

        _data->nextLineBufferMinY = _data->minY - 1;

        int lineOffsetSize = (dataWindow.max.y - dataWindow.min.y +
                              _data->linesInBuffer) / _data->linesInBuffer;

        _data->lineOffsets.resize (lineOffsetSize);

        for (size_t i = 0; i < _data->lineBuffers.size(); i++)
            _data->lineBuffers[i] = new LineBuffer ();

        _data->gotSampleCount.resizeErase(_data->maxY - _data->minY + 1);
        for (int i = 0; i < _data->maxY - _data->minY + 1; i++)
            _data->gotSampleCount[i] = false;

        _data->maxSampleCountTableSize = min(_data->linesInBuffer, _data->maxY - _data->minY + 1) *
                                        (_data->maxX - _data->minX + 1) *
                                        sizeof(unsigned int);

        _data->sampleCountTableBuffer.resizeErase(_data->maxSampleCountTableSize);

        _data->sampleCountTableComp = newCompressor(_data->header.compression(),
                                                    _data->maxSampleCountTableSize,
                                                    _data->header);

        _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);
        
        const ChannelList & c=header.channels();
        
        _data->combinedSampleSize=0;
        for(ChannelList::ConstIterator i=c.begin();i!=c.end();i++)
        {
            switch(i.channel().type)
            {
                case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF  :
                    _data->combinedSampleSize+=Xdr::size<half>();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT :
                    _data->combinedSampleSize+=Xdr::size<float>();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT  :
                    _data->combinedSampleSize+=Xdr::size<unsigned int>();
                    break;
                default :
                    THROW(IEX_NAMESPACE::ArgExc, "Bad type for channel " << i.name() << " initializing deepscanline reader");
                    
            }
        }
        
    }
    catch (...)
    {
        // Don't delete _data here, leave that to caller
        throw;
    }
}